

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

InternalParseResult * __thiscall
Catch::Clara::Detail::ParserBase::parse
          (InternalParseResult *__return_storage_ptr__,ParserBase *this,Args *args)

{
  string local_70;
  TokenStream local_50;
  StringRef local_28;
  
  local_28.m_start = (args->m_exeName).m_start;
  local_28.m_size = (args->m_exeName).m_size;
  StringRef::operator_cast_to_string(&local_70,&local_28);
  TokenStream::TokenStream(&local_50,args);
  (*this->_vptr_ParserBase[3])(__return_storage_ptr__,this,&local_70,&local_50);
  std::_Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::
  ~_Vector_base(&local_50.m_tokenBuffer.
                 super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
               );
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

InternalParseResult ParserBase::parse( Args const& args ) const {
                return parse( static_cast<std::string>(args.exeName()), TokenStream( args ) );
            }